

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
find_key(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
         *this,int *key)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int *in_RSI;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_RDI;
  int pos;
  int predicted_pos;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  byte bVar4;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *key_00;
  int in_stack_ffffffffffffffe4;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
  *in_stack_ffffffffffffffe8;
  
  in_RDI->num_lookups_ = in_RDI->num_lookups_ + 1;
  key_00 = in_RDI;
  predict_position(in_RDI,(int *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  iVar3 = exponential_search_upper_bound<int>
                    (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,(int *)key_00);
  iVar3 = iVar3 + -1;
  if (-1 < iVar3) {
    piVar1 = in_RDI->key_slots_;
    bVar2 = AlexCompare::operator()(in_RDI->key_less_,piVar1 + iVar3,in_RSI);
    bVar4 = 0;
    if (!bVar2) {
      bVar2 = AlexCompare::operator()(in_RDI->key_less_,in_RSI,piVar1 + iVar3);
      bVar4 = bVar2 ^ 0xff;
    }
    if ((bVar4 & 1) != 0) {
      return iVar3;
    }
  }
  return -1;
}

Assistant:

int find_key(const T& key) {
    num_lookups_++;
    int predicted_pos = predict_position(key);

    // The last key slot with a certain value is guaranteed to be a real key
    // (instead of a gap)
    int pos = exponential_search_upper_bound(predicted_pos, key) - 1;
    if (pos < 0 || !key_equal(ALEX_DATA_NODE_KEY_AT(pos), key)) {
      return -1;
    } else {
      return pos;
    }
  }